

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O1

void __thiscall
SemanticAnalyserTest_VariableAccessWorks_Test::~SemanticAnalyserTest_VariableAccessWorks_Test
          (SemanticAnalyserTest_VariableAccessWorks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableAccessWorks)
{
  std::string source = R"SRC(
  let global: f32 = 23;
  
  fn main(): f32
  {
    let x: f32 = 2*global;
    let y: f32 = x;
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}